

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void google::protobuf::internal::VerifyVersion(int protobufVersionCompiledWith,char *filename)

{
  LogMessage *pLVar1;
  int version;
  int version_00;
  char *filename_local;
  LogMessage local_60;
  string local_50;
  string local_30;
  
  if (protobufVersionCompiledWith == 0x5c0698) {
    return;
  }
  filename_local = filename;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common.cc"
             ,0x30);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_60,
                      (char (*) [53])"This program was compiled with Protobuf C++ version ");
  VersionString_abi_cxx11_(&local_30,(internal *)(ulong)(uint)protobufVersionCompiledWith,version);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_30);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [29])", but the linked version is ");
  VersionString_abi_cxx11_(&local_50,(internal *)0x5c0698,version_00);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_50);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [205])
                             ".  Please update your library.  If you compiled the program yourself, make sure thatyour headers are from the same version of Protocol Buffers as your link-time library.  (Version verification failed in \""
                     );
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar1,&filename_local);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [4])0x105bbb5);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

void VerifyVersion(int protobufVersionCompiledWith, const char* filename) {
  // If the user's program is linked against a different version of Protobuf,
  // GOOGLE_PROTOBUF_VERSION will have a different value.
  if (GOOGLE_PROTOBUF_VERSION != protobufVersionCompiledWith) {
    ABSL_LOG(FATAL)
        << "This program was compiled with Protobuf C++ version "
        << VersionString(protobufVersionCompiledWith)
        << ", but the linked version is "
        << VersionString(GOOGLE_PROTOBUF_VERSION)
        << ".  Please update your library.  If you compiled the program "
           "yourself, make sure that"
           "your headers are from the same version of Protocol Buffers as your "
           "link-time library.  (Version verification failed in \""
        << filename << "\".)";
  }
}